

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O2

Matrix * v2m(Matrix *__return_storage_ptr__,Vec3f *v)

{
  float fVar1;
  vector<float,_std::allocator<float>_> *pvVar2;
  
  Matrix::Matrix(__return_storage_ptr__,4,1);
  fVar1 = v->x;
  pvVar2 = Matrix::operator[](__return_storage_ptr__,0);
  *(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
   _M_start = fVar1;
  fVar1 = v->y;
  pvVar2 = Matrix::operator[](__return_storage_ptr__,1);
  *(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
   _M_start = fVar1;
  fVar1 = v->z;
  pvVar2 = Matrix::operator[](__return_storage_ptr__,2);
  *(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
   _M_start = fVar1;
  pvVar2 = Matrix::operator[](__return_storage_ptr__,3);
  *(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
   _M_start = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Matrix v2m(const Vec3f &v) {
    Matrix m(4, 1);
    m[0][0] = v.x;
    m[1][0] = v.y;
    m[2][0] = v.z;
    m[3][0] = 1.f;
    return m;
}